

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.cc
# Opt level: O1

string * __thiscall
kratos::InterfacePort::to_string_abi_cxx11_(string *__return_storage_ptr__,InterfacePort *this)

{
  pointer pcVar1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  format_args args;
  size_type *local_88;
  pointer pcStack_80;
  pointer local_78;
  size_type sStack_70;
  string local_60;
  size_type *psStack_40;
  string parent_name;
  
  pcVar1 = (this->interface_->name_)._M_dataplus._M_p;
  psStack_40 = &parent_name._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&psStack_40,pcVar1,pcVar1 + (this->interface_->name_)._M_string_length);
  Var::to_string_abi_cxx11_(&local_60,(Var *)this);
  local_88 = psStack_40;
  pcStack_80 = parent_name._M_dataplus._M_p;
  local_78 = local_60._M_dataplus._M_p;
  sStack_70 = local_60._M_string_length;
  format_str.size_ = 0xdd;
  format_str.data_ = (char *)0x7;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_88;
  fmt::v7::detail::vformat_abi_cxx11_(__return_storage_ptr__,(detail *)0x41443d,format_str,args);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (psStack_40 != &parent_name._M_string_length) {
    operator_delete(psStack_40,parent_name._M_string_length + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string InterfacePort::to_string() const {
    std::string parent_name = interface_->name();
    return ::format("{0}.{1}", parent_name, Var::to_string());
}